

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_value * mg_value_make_local_date_time(mg_local_date_time *param_1)

{
  mg_value *pmVar1;
  
  pmVar1 = (mg_value *)mg_allocator_malloc(&mg_system_allocator,0x10);
  if (pmVar1 != (mg_value *)0x0) {
    pmVar1->type = MG_VALUE_TYPE_LOCAL_DATE_TIME;
    (pmVar1->field_1).local_date_time_v = param_1;
  }
  return pmVar1;
}

Assistant:

mg_value *mg_value_make_local_date_time(mg_local_date_time *local_date_time) {
  mg_value *value = mg_allocator_malloc(&mg_system_allocator, sizeof(mg_value));
  if (!value) {
    return NULL;
  }
  value->type = MG_VALUE_TYPE_LOCAL_DATE_TIME;
  value->local_date_time_v = local_date_time;
  return value;
}